

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void __thiscall gl4cts::CopyImage::SmokeTest::SmokeTest(SmokeTest *this,Context *context)

{
  GLenum internal_format_00;
  bool bVar1;
  undefined1 local_5c [8];
  testCase test_case_1;
  GLenum type;
  GLenum format;
  GLenum internal_format;
  GLuint fmt_id;
  undefined1 local_30 [8];
  testCase test_case;
  GLenum target;
  GLuint tgt_id;
  Context *context_local;
  SmokeTest *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"smoke_test","Test tries all formats and targets");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SmokeTest_0322e5a8;
  this->m_dst_buf_name = 0;
  this->m_dst_tex_name = 0;
  this->m_rb_name = 0;
  this->m_src_buf_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  std::
  vector<gl4cts::CopyImage::SmokeTest::testCase,_std::allocator<gl4cts::CopyImage::SmokeTest::testCase>_>
  ::vector(&this->m_test_cases);
  for (test_case.m_type = 0; test_case.m_type < 0xb; test_case.m_type = test_case.m_type + 1) {
    test_case.m_format = *(GLenum *)(s_valid_targets + (ulong)test_case.m_type * 4);
    bVar1 = Utils::isTargetMultisampled(test_case.m_format);
    if (!bVar1) {
      local_30._0_4_ = test_case.m_format;
      local_30._4_4_ = 0x8d70;
      test_case.m_target = 0x8d99;
      test_case.m_internal_format = 0x1405;
      std::
      vector<gl4cts::CopyImage::SmokeTest::testCase,_std::allocator<gl4cts::CopyImage::SmokeTest::testCase>_>
      ::push_back(&this->m_test_cases,(value_type *)local_30);
    }
  }
  for (format = 0; format < 0x3d; format = format + 1) {
    internal_format_00 = *(GLenum *)(s_internal_formats + (ulong)format * 4);
    test_case_1.m_type = Utils::getFormat(internal_format_00);
    test_case_1.m_internal_format = Utils::getType(internal_format_00);
    local_5c._0_4_ = 0xde1;
    test_case_1.m_target = test_case_1.m_type;
    local_5c._4_4_ = internal_format_00;
    test_case_1.m_format = test_case_1.m_internal_format;
    std::
    vector<gl4cts::CopyImage::SmokeTest::testCase,_std::allocator<gl4cts::CopyImage::SmokeTest::testCase>_>
    ::push_back(&this->m_test_cases,(value_type *)local_5c);
  }
  return;
}

Assistant:

SmokeTest::SmokeTest(deqp::Context& context)
	: TestCase(context, "smoke_test", "Test tries all formats and targets")
	, m_dst_buf_name(0)
	, m_dst_tex_name(0)
	, m_rb_name(0)
	, m_src_buf_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	/* Iterate over valid targets */
	for (GLuint tgt_id = 0; tgt_id < s_n_valid_targets; ++tgt_id)
	{
		const GLenum target = s_valid_targets[tgt_id];

		if (true == Utils::isTargetMultisampled(target))
		{
			continue;
		}

		const testCase test_case = { target, GL_RGBA32UI, GL_RGBA_INTEGER, GL_UNSIGNED_INT };

		m_test_cases.push_back(test_case);
	}

	/* Iterate over internal formats */
	for (GLuint fmt_id = 0; fmt_id < s_n_internal_formats; ++fmt_id)
	{
		const GLenum internal_format = s_internal_formats[fmt_id];
		const GLenum format			 = Utils::getFormat(internal_format);
		const GLenum type			 = Utils::getType(internal_format);

		const testCase test_case = { GL_TEXTURE_2D, internal_format, format, type };

		m_test_cases.push_back(test_case);
	}
}